

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O1

SHMPTR SHMalloc(size_t size)

{
  int block_size;
  Volatile<void_*> VVar1;
  int iVar2;
  ulong uVar3;
  SHMPTR *pSVar4;
  undefined1 *puVar5;
  ulong uVar6;
  SHMPTR SVar7;
  LPVOID pvVar8;
  int *piVar9;
  long lVar10;
  int num_blocks;
  SHMPTR SVar11;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_003410a4;
  if (size == 0) {
    return 0;
  }
  piVar9 = block_sizes;
  uVar3 = 0;
  do {
    if (size <= (ulong)(long)*piVar9) goto LAB_00340c72;
    uVar3 = uVar3 + 1;
    piVar9 = piVar9 + 1;
  } while (uVar3 != 4);
  uVar3 = 4;
LAB_00340c72:
  if ((int)uVar3 == 4) {
    fprintf(_stderr,"] %s %s:%d","SHMalloc",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
            ,0x247);
    fprintf(_stderr,"Got request for shared memory block of %u bytes; maximum block size is %d.\n",
            size,0x808);
    return 0;
  }
  uVar3 = uVar3 & 0xffffffff;
  SHMLock();
  VVar1 = shm_segment_bases[0];
  if (*(int *)((long)shm_segment_bases[0].m_val + uVar3 * 0x18 + 0x50) == 0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_003410a4;
    if (shm_numsegments != 0x100) {
      iVar2 = 0;
      puVar5 = (undefined1 *)mmap64((void *)0x0,0x40000,3,0x22,-1,0);
      if (puVar5 != &DAT_ffffffffffffffff) {
        shm_segment_bases[shm_numsegments].m_val = puVar5;
        piVar9 = (int *)((long)shm_segment_bases[0].m_val + 0x50);
        lVar10 = 0;
        do {
          iVar2 = iVar2 + (piVar9[-1] - *piVar9) * *(int *)((long)block_sizes + lVar10);
          lVar10 = lVar10 + 4;
          piVar9 = piVar9 + 6;
        } while (lVar10 != 0x10);
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_003410a4;
        SVar11 = (SHMPTR)(int)(shm_numsegments << 0x18 | 0x40);
        piVar9 = (int *)((long)shm_segment_bases[0].m_val + 0x4c);
        lVar10 = 0;
        do {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_003410a4;
          block_size = *(int *)((long)block_sizes + lVar10);
          uVar6 = ((long)((*piVar9 - piVar9[1]) * block_size) * 0x3f748) / (long)iVar2;
          num_blocks = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff)
                            / (long)block_size) + 1;
          *(SHMPTR *)(puVar5 + lVar10 * 2) = SVar11;
          SVar7 = SHMLinkPool(SVar11,block_size,num_blocks);
          *(SHMPTR *)(puVar5 + lVar10 * 2 + 0x20) = SVar7;
          *(undefined8 *)
           ((long)shm_segment_bases[*(ulong *)(puVar5 + lVar10 * 2 + 0x20) >> 0x18 & 0xff].m_val +
           (ulong)((uint)*(undefined8 *)(puVar5 + lVar10 * 2 + 0x20) & 0xffffff)) =
               *(undefined8 *)(piVar9 + 3);
          *(undefined8 *)(piVar9 + 3) = *(undefined8 *)(puVar5 + lVar10 * 2);
          piVar9[1] = piVar9[1] + num_blocks;
          *piVar9 = *piVar9 + num_blocks;
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_003410a4;
          SVar11 = SVar11 + (long)(num_blocks * block_size);
          lVar10 = lVar10 + 4;
          piVar9 = piVar9 + 6;
        } while (lVar10 != 0x10);
        shm_numsegments = shm_numsegments + 1;
        goto LAB_00340ced;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_003410a4;
      piVar9 = __errno_location();
      strerror(*piVar9);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      lock_count.m_val = lock_count.m_val + -1;
      CCLock::Leave(&shm_critsec);
      return 0;
    }
    goto LAB_003410a4;
  }
LAB_00340ced:
  SVar11 = *(SHMPTR *)((long)VVar1.m_val + uVar3 * 0x18 + 0x58);
  pSVar4 = (SHMPTR *)SHMPtrToPtr(SVar11);
  if (SVar11 == 0) {
    fprintf(_stderr,"] %s %s:%d","SHMalloc",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
            ,0x268);
    fprintf(_stderr,"First free block in %d-byte pool (%08x) was invalid!\n",
            (ulong)(uint)block_sizes[uVar3],0);
    lock_count.m_val = lock_count.m_val + -1;
    CCLock::Leave(&shm_critsec);
    return 0;
  }
  SVar7 = *pSVar4;
  *(SHMPTR *)((long)VVar1.m_val + uVar3 * 0x18 + 0x58) = SVar7;
  iVar2 = *(int *)((long)VVar1.m_val + uVar3 * 0x18 + 0x50) + -1;
  *(int *)((long)VVar1.m_val + uVar3 * 0x18 + 0x50) = iVar2;
  if ((iVar2 == 0 && SVar7 != 0) || (SVar7 == 0 && iVar2 != 0)) {
    fprintf(_stderr,"] %s %s:%d","SHMalloc",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
            ,0x278);
    fprintf(_stderr,"free block count is %d, but next free block is %#x\n",
            (ulong)*(uint *)((long)VVar1.m_val + uVar3 * 0x18 + 0x50),SVar7);
LAB_00340d84:
    *(undefined8 *)((long)VVar1.m_val + uVar3 * 0x18 + 0x58) = 0;
    *(undefined4 *)((long)VVar1.m_val + uVar3 * 0x18 + 0x50) = 0;
  }
  else if ((SVar7 != 0) && (pvVar8 = SHMPtrToPtr(SVar7), pvVar8 == (LPVOID)0x0)) {
    fprintf(_stderr,"] %s %s:%d","SHMalloc",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
            ,0x280);
    fprintf(_stderr,"Next free block (%#x) in %d-byte pool is invalid!\n",SVar7,
            (ulong)(uint)block_sizes[uVar3]);
    goto LAB_00340d84;
  }
  lock_count.m_val = lock_count.m_val + -1;
  CCLock::Leave(&shm_critsec);
  if (PAL_InitializeChakraCoreCalled != false) {
    return SVar11;
  }
LAB_003410a4:
  abort();
}

Assistant:

SHMPTR SHMalloc(size_t size)
{
    enum SHM_POOL_SIZES sps;
    SHMPTR first_free;
    SHMPTR next_free;
    SHM_FIRST_HEADER *header;
    SHMPTR *shmptr_ptr;

    TRACE("SHMalloc() called; requested size is %u\n", size);

    if(0 == size)
    {
        WARN("Got a request for a 0-byte block! returning 0\n");
        return 0;
    }

    /* Find the first block size >= requested size */
    for (sps = static_cast<SHM_POOL_SIZES>(0); sps < SPS_LAST;
         sps = static_cast<SHM_POOL_SIZES>(sps + 1))
    {
        if (size <= static_cast<size_t>(block_sizes[sps]))
        {
            break;
        }
    }

    /* If no block size is found, requested size was too large. */
    if( SPS_LAST == sps )
    {
        ASSERT("Got request for shared memory block of %u bytes; maximum block "
              "size is %d.\n", size, block_sizes[SPS_LAST-1]);
        return 0;
    }

    TRACE("Best block size is %d (%d bytes wasted)\n",
          block_sizes[sps], block_sizes[sps]-size );

    log_waste(sps, block_sizes[sps]-size);

    SHMLock();
    header = (SHM_FIRST_HEADER *)shm_segment_bases[0].Load();

    /* If there are no free items of the specified size left, it's time to
       allocate a new shared memory segment.*/
    if(header->pools[sps].free_items == 0)
    {
        TRACE("No blocks of %d bytes left; allocating new segment.\n",
              block_sizes[sps]);
        if(!SHMAddSegment())
        {
            ERROR("Unable to allocate new shared memory segment!\n");
            SHMRelease();
            return 0;
        }
    }

    /* Remove the first free block from the pool */
    first_free = header->pools[sps].first_free;
    shmptr_ptr = static_cast<SHMPTR*>(SHMPTR_TO_PTR(first_free));

    if( 0 == first_free )
    {
        ASSERT("First free block in %d-byte pool (%08x) was invalid!\n",
              block_sizes[sps], first_free);
        SHMRelease();
        return 0;
    }

    /* the block "first_free" is the head of a linked list of free blocks;
       take the next link in the list and set it as new head of list. */
    next_free = *shmptr_ptr;
    header->pools[sps].first_free = next_free;
    header->pools[sps].free_items--;

    /* make sure we're still in a sane state */
    if(( 0 == header->pools[sps].free_items && 0 != next_free) ||
       ( 0 != header->pools[sps].free_items && 0 == next_free))
    {
        ASSERT("free block count is %d, but next free block is %#x\n",
               header->pools[sps].free_items, next_free);
        /* assume all remaining blocks in the pool are corrupt */
        header->pools[sps].first_free = 0;
        header->pools[sps].free_items = 0;
    }
    else if (0 != next_free && 0 == SHMPTR_TO_PTR(next_free) )
    {
        ASSERT("Next free block (%#x) in %d-byte pool is invalid!\n",
               next_free, block_sizes[sps]);
        /* assume all remaining blocks in the pool are corrupt */
        header->pools[sps].first_free = 0;
        header->pools[sps].free_items = 0;
    }

    SHMRelease();

    TRACE("Allocation successful; %d blocks of %d bytes left. Returning %08x\n",
          header->pools[sps].free_items, block_sizes[sps], first_free);
    return first_free;
}